

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  void *pvVar19;
  int iVar20;
  uint uVar21;
  size_t *psVar22;
  pointer pMVar23;
  Mat *pMVar24;
  uint uVar25;
  ulong uVar26;
  size_t *psVar27;
  void *pvVar28;
  pointer pMVar29;
  ulong uVar30;
  int k;
  float *pfVar31;
  uint uVar32;
  ulong uVar33;
  int *piVar34;
  int j;
  ulong uVar35;
  Allocator **ppAVar36;
  Mat *pMVar37;
  uint uVar38;
  float *pfVar39;
  float fVar40;
  Allocator *local_150;
  Mat local_138;
  Mat local_e8;
  undefined8 local_98;
  long local_90;
  undefined8 local_88;
  int *piStack_80;
  size_t *local_70;
  int *local_68;
  void *local_60;
  long local_58;
  Mat *local_50;
  ulong local_48;
  ulong local_40;
  float *local_38;
  
  if (this->int8_scale_term != 0) {
    iVar16 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar16;
  }
  if (this->constantA == 0) {
    pMVar37 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (this->constantB != 0) goto LAB_00432ef6;
    pMVar24 = pMVar37 + 1;
  }
  else {
    pMVar37 = &this->A_data;
    if (this->constantB == 0) {
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
LAB_00432ef6:
      pMVar24 = &this->B_data;
    }
  }
  sVar4 = pMVar37->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  if (this->transA == 0) {
    if (&local_e8 != pMVar37) {
      piVar34 = pMVar37->refcount;
      if (piVar34 != (int *)0x0) {
        LOCK();
        *piVar34 = *piVar34 + 1;
        UNLOCK();
      }
      local_e8.data = pMVar37->data;
      local_e8.refcount._0_4_ = SUB84(pMVar37->refcount,0);
      local_e8.refcount._4_4_ = (undefined4)((ulong)pMVar37->refcount >> 0x20);
      local_e8.elemsize = pMVar37->elemsize;
      local_e8.elempack = pMVar37->elempack;
      local_e8.allocator = pMVar37->allocator;
      uVar5 = pMVar37->dims;
      uVar6 = pMVar37->w;
      uVar7 = pMVar37->h;
      uVar8 = pMVar37->d;
      local_e8.w = uVar6;
      local_e8.h = uVar7;
      local_e8.d = uVar8;
      local_e8.c = pMVar37->c;
      local_e8.cstep = pMVar37->cstep;
      local_e8.dims = uVar5;
    }
  }
  else {
    Mat::create(&local_e8,(&pMVar37->h)[(ulong)(pMVar37->dims == 3) * 2],pMVar37->w,sVar4,
                opt->workspace_allocator);
    if (pMVar37->dims == 3) {
      iVar16 = (int)pMVar37->cstep;
    }
    else {
      iVar16 = pMVar37->w;
    }
    uVar26 = 0;
    uVar30 = 0;
    if (0 < local_e8.w) {
      uVar30 = (ulong)(uint)local_e8.w;
    }
    uVar17 = (ulong)(uint)local_e8.h;
    pvVar19 = local_e8.data;
    if (local_e8.h < 1) {
      uVar17 = uVar26;
    }
    for (; uVar26 != uVar17; uVar26 = uVar26 + 1) {
      uVar33 = uVar26;
      for (uVar35 = 0; uVar30 != uVar35; uVar35 = uVar35 + 1) {
        *(undefined4 *)((long)pvVar19 + uVar35 * 4) =
             *(undefined4 *)((long)pMVar37->data + uVar33 * 4);
        uVar33 = uVar33 + (long)iVar16;
      }
      pvVar19 = (void *)((long)pvVar19 + (long)local_e8.w * local_e8.elemsize);
    }
  }
  local_138.cstep = 0;
  local_138.data = (void *)0x0;
  local_138.refcount._0_4_ = 0;
  local_138.refcount._4_4_ = 0;
  local_138.elemsize = 0;
  local_138.elempack = 0;
  local_138.allocator = (Allocator *)0x0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_138,(&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2],pMVar24->w,sVar4,
                opt->workspace_allocator);
    if (pMVar24->dims == 3) {
      iVar16 = (int)pMVar24->cstep;
    }
    else {
      iVar16 = pMVar24->w;
    }
    uVar26 = 0;
    uVar30 = 0;
    if (0 < local_138.w) {
      uVar30 = (ulong)(uint)local_138.w;
    }
    uVar17 = (ulong)(uint)local_138.h;
    pvVar19 = local_138.data;
    if (local_138.h < 1) {
      uVar17 = uVar26;
    }
    for (; iVar20 = local_138.dims, uVar18 = local_138.h, uVar26 != uVar17; uVar26 = uVar26 + 1) {
      uVar33 = uVar26;
      for (uVar35 = 0; uVar30 != uVar35; uVar35 = uVar35 + 1) {
        *(undefined4 *)((long)pvVar19 + uVar35 * 4) =
             *(undefined4 *)((long)pMVar24->data + uVar33 * 4);
        uVar33 = uVar33 + (long)iVar16;
      }
      pvVar19 = (void *)((long)pvVar19 + (long)local_138.w * local_138.elemsize);
    }
  }
  else if (&local_138 == pMVar24) {
    iVar20 = 0;
    uVar18 = 0;
  }
  else {
    piVar34 = pMVar24->refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    local_138.data = pMVar24->data;
    local_138.refcount._0_4_ = SUB84(pMVar24->refcount,0);
    local_138.refcount._4_4_ = (undefined4)((ulong)pMVar24->refcount >> 0x20);
    local_138.elemsize = pMVar24->elemsize;
    local_138.elempack = pMVar24->elempack;
    local_138.allocator = pMVar24->allocator;
    uVar9 = pMVar24->dims;
    uVar10 = pMVar24->w;
    uVar11 = pMVar24->h;
    uVar12 = pMVar24->d;
    local_138.w = uVar10;
    local_138.h = uVar11;
    local_138.d = uVar12;
    local_138.c = pMVar24->c;
    local_138.cstep = pMVar24->cstep;
    iVar20 = pMVar24->dims;
    uVar18 = pMVar24->h;
    local_138.dims = uVar9;
  }
  uVar3 = (&local_e8.h)[(ulong)(local_e8.dims == 3) * 2];
  if (iVar20 == 3) {
    uVar18 = local_138.c;
  }
  if (this->constantC != 0) {
    piVar34 = (this->C_data).refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    pfVar39 = (float *)(this->C_data).data;
    piStack_80 = (this->C_data).refcount;
    local_150 = (this->C_data).allocator;
    uVar32 = this->constant_broadcast_type_C;
    goto LAB_00433278;
  }
  if (this->constantB == 0 || this->constantA == 0) {
    pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (this->constantA != 0 || this->constantB != 0) {
LAB_004335e7:
      if ((long)pMVar23 - (long)pMVar29 == 0x90) {
        piVar34 = pMVar29[1].refcount;
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + 1;
          UNLOCK();
        }
        pvVar19 = pMVar29[1].data;
        pfVar39 = (float *)pMVar29[1].data;
        piStack_80 = pMVar29[1].refcount;
        ppAVar36 = &pMVar29[1].allocator;
        piVar34 = &pMVar29[1].c;
        psVar22 = &pMVar29[1].cstep;
        iVar16 = pMVar29[1].dims;
        uVar21 = pMVar29[1].w;
        uVar25 = pMVar29[1].h;
        goto LAB_0043367d;
      }
    }
    if ((long)pMVar23 - (long)pMVar29 != 0xd8) {
      local_150 = (Allocator *)0x0;
      pfVar39 = (float *)0x0;
      piStack_80 = (int *)0x0;
      uVar32 = 0;
      goto LAB_00433278;
    }
    piVar34 = pMVar29[2].refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    pvVar19 = pMVar29[2].data;
    pfVar39 = (float *)pMVar29[2].data;
    piStack_80 = pMVar29[2].refcount;
    ppAVar36 = &pMVar29[2].allocator;
    piVar34 = &pMVar29[2].c;
    psVar22 = &pMVar29[2].cstep;
    iVar16 = pMVar29[2].dims;
    uVar21 = pMVar29[2].w;
    uVar25 = pMVar29[2].h;
  }
  else {
    pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pMVar23 - (long)pMVar29 != 0x48) goto LAB_004335e7;
    piVar34 = pMVar29->refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + 1;
      UNLOCK();
    }
    pvVar19 = pMVar29->data;
    pfVar39 = (float *)pMVar29->data;
    piStack_80 = pMVar29->refcount;
    ppAVar36 = &pMVar29->allocator;
    piVar34 = &pMVar29->c;
    psVar22 = &pMVar29->cstep;
    iVar16 = pMVar29->dims;
    uVar21 = pMVar29->w;
    uVar25 = pMVar29->h;
  }
LAB_0043367d:
  local_150 = *ppAVar36;
  uVar32 = 0;
  if ((pvVar19 != (void *)0x0) && ((long)*piVar34 * *psVar22 != 0)) {
    uVar32 = (uint)(uVar21 == uVar3 && iVar16 == 1);
    uVar38 = uVar32;
    if (uVar21 == uVar18) {
      uVar38 = 4;
    }
    if (iVar16 != 1) {
      uVar38 = uVar32;
    }
    uVar32 = 2;
    if (uVar25 != uVar3) {
      uVar32 = uVar38;
    }
    if (uVar21 != 1) {
      uVar32 = uVar38;
    }
    if (iVar16 != 2) {
      uVar32 = uVar38;
    }
    uVar38 = 3;
    if (uVar25 != uVar3) {
      uVar38 = uVar32;
    }
    if (uVar21 != uVar18) {
      uVar38 = uVar32;
    }
    if ((iVar16 == 2) && (uVar32 = uVar38, uVar25 == 1 && uVar21 == uVar18)) {
      uVar32 = 4;
    }
  }
LAB_00433278:
  pMVar37 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar21 = uVar18;
  if (this->output_transpose == 0) {
    uVar21 = uVar3;
    uVar3 = uVar18;
  }
  local_88 = pfVar39;
  if (this->output_N1M == 0) {
    Mat::create(pMVar37,uVar3,uVar21,sVar4,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar37,uVar3,1,uVar21,sVar4,opt->blob_allocator);
  }
  local_98 = 0xffffffffffffff9c;
  if ((pMVar37->data != (void *)0x0) && ((long)pMVar37->c * pMVar37->cstep != 0)) {
    fVar1 = this->alpha;
    fVar2 = this->beta;
    iVar16 = this->output_transpose;
    uVar18 = (&local_138.h)[(ulong)(local_138.dims == 3) * 2];
    local_58 = (long)(int)uVar18;
    uVar3 = local_e8.w;
    if (local_e8.w < 1) {
      uVar3 = 0;
    }
    uVar26 = 0;
    if (0 < (int)uVar18) {
      uVar26 = (ulong)uVar18;
    }
    iVar20 = pMVar37->dims;
    local_98 = 0;
    uVar18 = (&local_e8.h)[(ulong)(local_e8.dims == 3) * 2];
    if ((&local_e8.h)[(ulong)(local_e8.dims == 3) * 2] < 1) {
      uVar18 = 0;
    }
    local_48 = (ulong)uVar18;
    local_60 = local_e8.data;
    local_68 = &pMVar37->w;
    local_70 = &pMVar37->cstep;
    local_90 = 0;
    uVar30 = 0;
    while (uVar17 = uVar30, local_50 = pMVar37, uVar17 != local_48) {
      psVar22 = (size_t *)local_68;
      if (iVar20 == 3) {
        psVar22 = local_70;
      }
      psVar27 = (size_t *)&local_e8.w;
      if (local_e8.dims == 3) {
        psVar27 = &local_e8.cstep;
      }
      sVar4 = *psVar22;
      psVar22 = (size_t *)&local_138.w;
      if (local_138.dims == 3) {
        psVar22 = &local_138.cstep;
      }
      sVar14 = *psVar27;
      sVar15 = *psVar22;
      pvVar19 = pMVar37->data;
      local_38 = pfVar39 + uVar17 * local_58;
      pvVar28 = local_138.data;
      for (uVar30 = 0; uVar30 != uVar26; uVar30 = uVar30 + 1) {
        if (pfVar39 == (float *)0x0) {
          fVar40 = 0.0;
        }
        else {
          pfVar31 = pfVar39;
          switch(uVar32) {
          case 0:
            break;
          case 1:
          case 2:
            pfVar31 = pfVar39 + uVar17;
            break;
          case 3:
            pfVar31 = local_38 + uVar30;
            break;
          case 4:
            pfVar31 = pfVar39 + uVar30;
            break;
          default:
            fVar40 = 0.0;
            goto LAB_004334eb;
          }
          fVar40 = *pfVar31;
LAB_004334eb:
          fVar40 = fVar40 * fVar2;
        }
        for (uVar33 = 0; uVar3 != uVar33; uVar33 = uVar33 + 1) {
          fVar40 = fVar40 + *(float *)((long)pvVar28 + uVar33 * 4) *
                            *(float *)((long)local_e8.data + uVar33 * 4 + (int)sVar14 * local_90);
        }
        lVar13 = uVar30 * (long)(int)sVar4 * 4 + uVar17 * 4;
        if (iVar16 == 0) {
          lVar13 = uVar30 * 4 + uVar17 * (long)(int)sVar4 * 4;
        }
        *(float *)((long)pvVar19 + lVar13) = fVar40 * fVar1;
        pvVar28 = (void *)((long)pvVar28 + (long)(int)sVar15 * 4);
      }
      local_90 = local_90 + 4;
      local_40 = uVar17;
      uVar30 = uVar17 + 1;
    }
  }
  piVar34 = (int *)CONCAT44(local_88._4_4_,piStack_80._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_150 == (Allocator *)0x0) {
        free(local_88);
      }
      else {
        (*local_150->_vptr_Allocator[3])();
      }
    }
  }
  piVar34 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        free(local_138.data);
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar34 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        free(local_e8.data);
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return (int)local_98;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif // NCNN_INT8

    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat BT;
    if (transB == 0)
    {
        // transpose B to col-major
        BT.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < BT.h; i++)
        {
            float* ptr = BT.row(i);
            for (int j = 0; j < BT.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        BT = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int N = BT.dims == 3 ? BT.c : BT.h;

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB && bottom_blobs.size() == 1)
        {
            C = bottom_blobs[0];
        }
        else if ((constantA || constantB) && bottom_blobs.size() == 2)
        {
            C = bottom_blobs[1];
        }
        else if (bottom_blobs.size() == 3)
        {
            C = bottom_blobs[2];
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    gemm_transB(A, BT, C, top_blob, alpha, beta, broadcast_type_C, output_transpose, opt);

    return 0;
}